

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int bmcg_sat_solver_add_and
              (bmcg_sat_solver *s,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1,int fCompl)

{
  int iVar2;
  int local_38;
  int local_34;
  int Lits [3];
  int fCompl1_local;
  int fCompl0_local;
  int iVar1_local;
  int iVar0_local;
  int iVar_local;
  bmcg_sat_solver *s_local;
  
  Lits[1] = fCompl1;
  Lits[2] = fCompl0;
  local_38 = Abc_Var2Lit(iVar,(uint)((fCompl != 0 ^ 0xffU) & 1));
  local_34 = Abc_Var2Lit(iVar0,Lits[2]);
  iVar2 = bmcg_sat_solver_addclause(s,&local_38,2);
  if (iVar2 == 0) {
    s_local._4_4_ = 0;
  }
  else {
    local_38 = Abc_Var2Lit(iVar,(uint)((fCompl != 0 ^ 0xffU) & 1));
    local_34 = Abc_Var2Lit(iVar1,Lits[1]);
    iVar2 = bmcg_sat_solver_addclause(s,&local_38,2);
    if (iVar2 == 0) {
      s_local._4_4_ = 0;
    }
    else {
      local_38 = Abc_Var2Lit(iVar,fCompl);
      local_34 = Abc_Var2Lit(iVar0,(uint)((Lits[2] != 0 ^ 0xffU) & 1));
      Lits[0] = Abc_Var2Lit(iVar1,(uint)((Lits[1] != 0 ^ 0xffU) & 1));
      iVar2 = bmcg_sat_solver_addclause(s,&local_38,3);
      if (iVar2 == 0) {
        s_local._4_4_ = 0;
      }
      else {
        s_local._4_4_ = 1;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

int bmcg_sat_solver_add_and( bmcg_sat_solver * s, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1, int fCompl )
{
    int Lits[3];

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, fCompl0 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar1, fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar,   fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, !fCompl0 );
    Lits[2] = Abc_Var2Lit( iVar1, !fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 3 ) )
        return 0;

    return 1;
}